

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  LogFinisher local_fa;
  byte local_f9;
  LogMessage local_f8;
  int local_bc;
  uint8 *puStack_b8;
  int buffer_size;
  void *void_buffer;
  LogMessage local_a8;
  int local_6c;
  LogFinisher local_65;
  int current_position;
  byte local_51;
  LogMessage local_50;
  CodedInputStream *local_18;
  CodedInputStream *this_local;
  
  local_18 = this;
  iVar2 = BufferSize(this);
  local_51 = 0;
  if (iVar2 != 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1e7);
    local_51 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (0) == (BufferSize()): ");
    internal::LogFinisher::operator=(&local_65,pLVar3);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
     (this->total_bytes_read_ != this->current_limit_)) {
    if ((-1 < this->total_bytes_warning_threshold_) &&
       (this->total_bytes_warning_threshold_ <= this->total_bytes_read_)) {
      internal::LogMessage::LogMessage
                (&local_a8,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1f9);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_a8,
                          "Reading dangerously large protocol message.  If the message turns out to be larger than "
                         );
      pLVar3 = internal::LogMessage::operator<<(pLVar3,this->total_bytes_limit_);
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,
                          " bytes, parsing will be halted for security reasons.  To increase the limit (or to disable these warnings), see CodedInputStream::SetTotalBytesLimit() in google/protobuf/io/coded_stream.h."
                         );
      internal::LogFinisher::operator=((LogFinisher *)((long)&void_buffer + 7),pLVar3);
      internal::LogMessage::~LogMessage(&local_a8);
      this->total_bytes_warning_threshold_ = -2;
    }
    bVar1 = anon_unknown_1::NextNonEmpty(this->input_,&stack0xffffffffffffff48,&local_bc);
    if (bVar1) {
      this->buffer_ = puStack_b8;
      this->buffer_end_ = this->buffer_ + local_bc;
      local_f9 = 0;
      if (local_bc < 0) {
        internal::LogMessage::LogMessage
                  (&local_f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                   ,0x20a);
        local_f9 = 1;
        pLVar3 = internal::LogMessage::operator<<(&local_f8,"CHECK failed: (buffer_size) >= (0): ");
        internal::LogFinisher::operator=(&local_fa,pLVar3);
      }
      if ((local_f9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_f8);
      }
      if (0x7fffffff - local_bc < this->total_bytes_read_) {
        this->overflow_bytes_ = this->total_bytes_read_ - (0x7fffffff - local_bc);
        this->buffer_end_ = this->buffer_end_ + -(long)this->overflow_bytes_;
        this->total_bytes_read_ = 0x7fffffff;
      }
      else {
        this->total_bytes_read_ = local_bc + this->total_bytes_read_;
      }
      RecomputeBufferLimits(this);
      this_local._7_1_ = true;
    }
    else {
      this->buffer_ = (uint8 *)0x0;
      this->buffer_end_ = (uint8 *)0x0;
      this_local._7_1_ = false;
    }
  }
  else {
    local_6c = this->total_bytes_read_ - this->buffer_size_after_limit_;
    if ((this->total_bytes_limit_ <= local_6c) && (this->total_bytes_limit_ != this->current_limit_)
       ) {
      PrintTotalBytesLimitError(this);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CodedInputStream::Refresh() {
  GOOGLE_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  if (total_bytes_warning_threshold_ >= 0 &&
      total_bytes_read_ >= total_bytes_warning_threshold_) {
      GOOGLE_LOG(WARNING) << "Reading dangerously large protocol message.  If the "
                      "message turns out to be larger than "
                   << total_bytes_limit_ << " bytes, parsing will be halted "
                      "for security reasons.  To increase the limit (or to "
                      "disable these warnings), see "
                      "CodedInputStream::SetTotalBytesLimit() in "
                      "google/protobuf/io/coded_stream.h.";

    // Don't warn again for this stream, and print total size at the end.
    total_bytes_warning_threshold_ = -2;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    GOOGLE_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}